

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall QPDFWriter::writeObjectStream(QPDFWriter *this,QPDFObjectHandle *object)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  element_type *peVar5;
  Object *pOVar6;
  mapped_type *this_00;
  NewObject *pNVar7;
  reference pvVar8;
  qpdf_offset_t qVar9;
  size_type __val;
  string_view sVar10;
  byte local_5a1;
  string_view local_588;
  string_view local_578;
  string_view local_568;
  undefined1 local_558 [8];
  PipelinePopper pp_enc;
  string_view local_538;
  string_view local_528;
  QPDFObjectHandle local_518;
  string_view local_508;
  string_view local_4f8;
  allocator<char> local_4e1;
  string local_4e0 [32];
  undefined1 local_4c0 [8];
  QPDFObjectHandle extends;
  QPDFObjectHandle dict;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  string_view local_460;
  string_view local_450;
  string local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  string_view local_400;
  string_view local_3f0;
  string_view local_3e0;
  string local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  string_view local_390;
  unsigned_long local_380;
  size_t length;
  string_view local_368;
  string_view local_358;
  string_view local_348;
  string_view local_338;
  action_e local_324;
  unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> local_320;
  unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> local_318;
  unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> local_310;
  undefined1 local_308 [8];
  PipelinePopper pp_discard;
  longlong *iter;
  iterator __end1_1;
  iterator __begin1_1;
  vector<long_long,_std::allocator<long_long>_> *__range1_1;
  PipelinePopper pp_ostream;
  qpdf_offset_t local_2c0;
  int local_2b8;
  QPDFObjectHandle local_2b0;
  QPDFObjectHandle local_2a0;
  allocator<char> local_289;
  string local_288;
  QPDFObjGen local_268;
  undefined1 local_260 [8];
  QPDFObjectHandle obj_to_write;
  string_view local_248;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  string_view local_1f8;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string_view local_1a8;
  string local_198;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string_view local_f8;
  QPDFObjGen local_e8;
  int local_dc;
  reference pQStack_d8;
  int new_obj;
  QPDFObjGen *obj;
  iterator __end1;
  iterator __begin1;
  mapped_type *__range1;
  int count;
  undefined1 local_a8 [8];
  PipelinePopper pp_ostream_pass1;
  undefined1 local_90 [3];
  bool compressed;
  int first_obj;
  string stream_buffer_pass2;
  string stream_buffer_pass1;
  qpdf_offset_t first;
  vector<long_long,_std::allocator<long_long>_> offsets;
  int local_24;
  int new_stream_id;
  int old_id;
  QPDFObjGen old_og;
  QPDFObjectHandle *object_local;
  QPDFWriter *this_local;
  
  old_og = (QPDFObjGen)object;
  _new_stream_id = QPDFObjectHandle::getObjGen(object);
  iVar3 = QPDFObjGen::getGen((QPDFObjGen *)&new_stream_id);
  if (iVar3 != 0) {
    __assert_fail("old_og.getGen() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFWriter.cc"
                  ,0x674,"void QPDFWriter::writeObjectStream(QPDFObjectHandle)");
  }
  local_24 = QPDFObjGen::getObj((QPDFObjGen *)&new_stream_id);
  peVar5 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  offsets.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)_new_stream_id;
  pOVar6 = ObjTable<QPDFWriter::Object>::operator[]
                     (&(peVar5->obj).super_ObjTable<QPDFWriter::Object>,_new_stream_id);
  iVar3 = pOVar6->renumber;
  std::vector<long_long,_std::allocator<long_long>_>::vector
            ((vector<long_long,_std::allocator<long_long>_> *)&first);
  std::__cxx11::string::string((string *)(stream_buffer_pass2.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_90);
  pp_ostream_pass1.stack_id._4_4_ = -1;
  peVar5 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  local_5a1 = 0;
  if ((peVar5->compress_streams & 1U) != 0) {
    peVar5 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    local_5a1 = peVar5->qdf_mode ^ 0xff;
  }
  pp_ostream_pass1.stack_id._3_1_ = local_5a1 & 1;
  PipelinePopper::PipelinePopper((PipelinePopper *)local_a8,this);
  activatePipelineStack
            (this,(PipelinePopper *)local_a8,(string *)((long)&stream_buffer_pass2.field_2 + 8));
  __range1._0_4_ = -1;
  peVar5 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  this_00 = std::
            map<int,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>_>_>_>
            ::operator[](&peVar5->object_stream_to_objects,&local_24);
  __end1 = std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>::begin(this_00);
  obj = (QPDFObjGen *)std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>::end(this_00);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<QPDFObjGen_*,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>_>
                                *)&obj);
    if (!bVar2) break;
    pQStack_d8 = __gnu_cxx::
                 __normal_iterator<QPDFObjGen_*,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>_>
                 ::operator*(&__end1);
    __range1._0_4_ = (int)__range1 + 1;
    peVar5 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    local_e8 = *pQStack_d8;
    pOVar6 = ObjTable<QPDFWriter::Object>::operator[]
                       (&(peVar5->obj).super_ObjTable<QPDFWriter::Object>,local_e8);
    local_dc = pOVar6->renumber;
    if (pp_ostream_pass1.stack_id._4_4_ == -1) {
      pp_ostream_pass1.stack_id._4_4_ = local_dc;
    }
    peVar5 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    if ((peVar5->qdf_mode & 1U) != 0) {
      std::__cxx11::to_string(&local_178,local_dc);
      std::operator+(&local_158,"%% Object stream: object ",&local_178);
      std::operator+(&local_138,&local_158,", index ");
      std::__cxx11::to_string(&local_198,(int)__range1);
      std::operator+(&local_118,&local_138,&local_198);
      sVar10 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_118);
      local_f8 = sVar10;
      writeString(this,sVar10);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_178);
      peVar5 = std::
               __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      if ((peVar5->suppress_original_object_ids & 1U) == 0) {
        iVar4 = QPDFObjGen::getObj(pQStack_d8);
        std::__cxx11::to_string(&local_1e8,iVar4);
        std::operator+(&local_1c8,"; original object ID: ",&local_1e8);
        sVar10 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1c8);
        local_1a8 = sVar10;
        writeString(this,sVar10);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1e8);
        iVar4 = QPDFObjGen::getGen(pQStack_d8);
        if (iVar4 != 0) {
          QTC::TC("qpdf","QPDFWriter original obj non-zero gen",0);
          iVar4 = QPDFObjGen::getGen(pQStack_d8);
          std::__cxx11::to_string(&local_238,iVar4);
          std::operator+(&local_218," ",&local_238);
          sVar10 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_218);
          local_1f8 = sVar10;
          writeString(this,sVar10);
          std::__cxx11::string::~string((string *)&local_218);
          std::__cxx11::string::~string((string *)&local_238);
        }
      }
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_248,"\n");
      writeString(this,local_248);
    }
    peVar5 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    obj_to_write.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ::qpdf::pl::Count::getCount(peVar5->pipeline);
    std::vector<long_long,_std::allocator<long_long>_>::push_back
              ((vector<long_long,_std::allocator<long_long>_> *)&first,
               (value_type_conflict2 *)
               &obj_to_write.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    indicateProgress(this,true,false);
    peVar5 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    local_268 = *pQStack_d8;
    QPDF::getObject((QPDF *)local_260,(QPDFObjGen)peVar5->pdf);
    bVar2 = QPDFObjectHandle::isStream((QPDFObjectHandle *)local_260);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_288,"stream found inside object stream; treating as null",
                 &local_289);
      QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)local_260,&local_288);
      std::__cxx11::string::~string((string *)&local_288);
      std::allocator<char>::~allocator(&local_289);
      QPDFObjectHandle::newNull();
      QPDFObjectHandle::operator=((QPDFObjectHandle *)local_260,&local_2a0);
      QPDFObjectHandle::~QPDFObjectHandle(&local_2a0);
    }
    QPDFObjectHandle::QPDFObjectHandle(&local_2b0,(QPDFObjectHandle *)local_260);
    writeObject(this,&local_2b0,(int)__range1);
    QPDFObjectHandle::~QPDFObjectHandle(&local_2b0);
    QPDFXRefEntry::QPDFXRefEntry((QPDFXRefEntry *)&pp_ostream.stack_id,iVar3,(int)__range1);
    peVar5 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    pNVar7 = ObjTable<QPDFWriter::NewObject>::operator[]
                       (&(peVar5->new_obj).super_ObjTable<QPDFWriter::NewObject>,local_dc);
    *(unsigned_long *)&pNVar7->xref = pp_ostream.stack_id;
    (pNVar7->xref).field1 = local_2c0;
    (pNVar7->xref).field2 = local_2b8;
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_260);
    __gnu_cxx::
    __normal_iterator<QPDFObjGen_*,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>_>::
    operator++(&__end1);
  }
  PipelinePopper::~PipelinePopper((PipelinePopper *)local_a8);
  PipelinePopper::PipelinePopper((PipelinePopper *)&__range1_1,this);
  pvVar8 = std::vector<long_long,_std::allocator<long_long>_>::at
                     ((vector<long_long,_std::allocator<long_long>_> *)&first,0);
  lVar1 = *pvVar8;
  __end1_1 = std::vector<long_long,_std::allocator<long_long>_>::begin
                       ((vector<long_long,_std::allocator<long_long>_> *)&first);
  iter = (longlong *)
         std::vector<long_long,_std::allocator<long_long>_>::end
                   ((vector<long_long,_std::allocator<long_long>_> *)&first);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                        *)&iter);
    if (!bVar2) break;
    pp_discard.stack_id =
         (unsigned_long)
         __gnu_cxx::
         __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>::
         operator*(&__end1_1);
    *(long *)pp_discard.stack_id = *(long *)pp_discard.stack_id - lVar1;
    __gnu_cxx::__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>::
    operator++(&__end1_1);
  }
  PipelinePopper::PipelinePopper((PipelinePopper *)local_308,this);
  std::unique_ptr<qpdf::pl::Link,std::default_delete<qpdf::pl::Link>>::
  unique_ptr<std::default_delete<qpdf::pl::Link>,void>
            ((unique_ptr<qpdf::pl::Link,std::default_delete<qpdf::pl::Link>> *)&local_310,
             (nullptr_t)0x0);
  activatePipelineStack(this,(PipelinePopper *)local_308,true,(string *)0x0,&local_310);
  std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr(&local_310);
  writeObjectStreamOffsets
            (this,(vector<long_long,_std::allocator<long_long>_> *)&first,
             pp_ostream_pass1.stack_id._4_4_);
  peVar5 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  qVar9 = ::qpdf::pl::Count::getCount(peVar5->pipeline);
  PipelinePopper::~PipelinePopper((PipelinePopper *)local_308);
  if ((pp_ostream_pass1.stack_id._3_1_ & 1) == 0) {
    activatePipelineStack(this,(PipelinePopper *)&__range1_1,(string *)local_90);
  }
  else {
    ::qpdf::pl::create<qpdf::pl::String,std::__cxx11::string&>
              ((pl *)&local_320,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
    local_324 = a_deflate;
    ::qpdf::pl::create<Pl_Flate,Pl_Flate::action_e>((pl *)&local_318,&local_320,&local_324);
    activatePipelineStack(this,(PipelinePopper *)&__range1_1,&local_318);
    std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr(&local_318);
    std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr(&local_320);
  }
  writeObjectStreamOffsets
            (this,(vector<long_long,_std::allocator<long_long>_> *)&first,
             pp_ostream_pass1.stack_id._4_4_);
  local_338 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)(stream_buffer_pass2.field_2._M_local_buf + 8));
  writeString(this,local_338);
  std::__cxx11::string::clear();
  std::__cxx11::string::shrink_to_fit();
  PipelinePopper::~PipelinePopper((PipelinePopper *)&__range1_1);
  openObject(this,iVar3);
  setDataKey(this,iVar3);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_348,"<<");
  writeString(this,local_348);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_358,"\n ");
  writeStringQDF(this,local_358);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_368," /Type /ObjStm");
  writeString(this,local_368);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&length,"\n ");
  writeStringQDF(this,_length);
  local_380 = std::__cxx11::string::size();
  adjustAESStreamLength(this,&local_380);
  std::__cxx11::to_string(&local_3d0,local_380);
  std::operator+(&local_3b0," /Length ",&local_3d0);
  local_390 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_3b0);
  writeString(this,local_390);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3e0,"\n ");
  writeStringQDF(this,local_3e0);
  if ((pp_ostream_pass1.stack_id._3_1_ & 1) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_3f0," /Filter /FlateDecode");
    writeString(this,local_3f0);
  }
  __val = std::vector<long_long,_std::allocator<long_long>_>::size
                    ((vector<long_long,_std::allocator<long_long>_> *)&first);
  std::__cxx11::to_string(&local_440,__val);
  std::operator+(&local_420," /N ",&local_440);
  local_400 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_420);
  writeString(this,local_400);
  std::__cxx11::string::~string((string *)&local_420);
  std::__cxx11::string::~string((string *)&local_440);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_450,"\n ");
  writeStringQDF(this,local_450);
  std::__cxx11::to_string
            ((string *)
             &dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,qVar9 + lVar1);
  std::operator+(&local_480," /First ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &dict.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_460 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_480);
  writeString(this,local_460);
  std::__cxx11::string::~string((string *)&local_480);
  std::__cxx11::string::~string
            ((string *)
             &dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  bVar2 = QPDFObjectHandle::isNull(object);
  if (!bVar2) {
    QPDFObjectHandle::getDict
              ((QPDFObjectHandle *)
               &extends.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_4e0,"/Extends",&local_4e1);
    QPDFObjectHandle::getKey
              ((QPDFObjectHandle *)local_4c0,
               (string *)
               &extends.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string(local_4e0);
    std::allocator<char>::~allocator(&local_4e1);
    bVar2 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)local_4c0);
    if (bVar2) {
      QTC::TC("qpdf","QPDFWriter copy Extends",0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_4f8,"\n ");
      writeStringQDF(this,local_4f8);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_508," /Extends ");
      writeString(this,local_508);
      QPDFObjectHandle::QPDFObjectHandle(&local_518,(QPDFObjectHandle *)local_4c0);
      unparseChild(this,&local_518,1,4);
      QPDFObjectHandle::~QPDFObjectHandle(&local_518);
    }
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_4c0);
    QPDFObjectHandle::~QPDFObjectHandle
              ((QPDFObjectHandle *)
               &extends.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_528,"\n");
  writeStringQDF(this,local_528);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_538," ");
  writeStringNoQDF(this,local_538);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&pp_enc.stack_id,">>\nstream\n");
  writeString(this,stack0xfffffffffffffab8);
  peVar5 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar5->encrypted & 1U) != 0) {
    QTC::TC("qpdf","QPDFWriter encrypt object stream",0);
  }
  PipelinePopper::PipelinePopper((PipelinePopper *)local_558,this);
  pushEncryptionFilter(this,(PipelinePopper *)local_558);
  local_568 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_90);
  writeString(this,local_568);
  PipelinePopper::~PipelinePopper((PipelinePopper *)local_558);
  peVar5 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar5->newline_before_endstream & 1U) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_578,"\n");
    writeString(this,local_578);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_588,"endstream");
  writeString(this,local_588);
  std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this);
  std::__cxx11::string::clear();
  closeObject(this,iVar3);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)(stream_buffer_pass2.field_2._M_local_buf + 8));
  std::vector<long_long,_std::allocator<long_long>_>::~vector
            ((vector<long_long,_std::allocator<long_long>_> *)&first);
  return;
}

Assistant:

void
QPDFWriter::writeObjectStream(QPDFObjectHandle object)
{
    // Note: object might be null if this is a place-holder for an object stream that we are
    // generating from scratch.

    QPDFObjGen old_og = object.getObjGen();
    qpdf_assert_debug(old_og.getGen() == 0);
    int old_id = old_og.getObj();
    int new_stream_id = m->obj[old_og].renumber;

    std::vector<qpdf_offset_t> offsets;
    qpdf_offset_t first = 0;

    // Generate stream itself.  We have to do this in two passes so we can calculate offsets in the
    // first pass.
    std::string stream_buffer_pass1;
    std::string stream_buffer_pass2;
    int first_obj = -1;
    const bool compressed = m->compress_streams && !m->qdf_mode;
    {
        // Pass 1
        PipelinePopper pp_ostream_pass1(this);
        activatePipelineStack(pp_ostream_pass1, stream_buffer_pass1);

        int count = -1;
        for (auto const& obj: m->object_stream_to_objects[old_id]) {
            ++count;
            int new_obj = m->obj[obj].renumber;
            if (first_obj == -1) {
                first_obj = new_obj;
            }
            if (m->qdf_mode) {
                writeString(
                    "%% Object stream: object " + std::to_string(new_obj) + ", index " +
                    std::to_string(count));
                if (!m->suppress_original_object_ids) {
                    writeString("; original object ID: " + std::to_string(obj.getObj()));
                    // For compatibility, only write the generation if non-zero.  While object
                    // streams only allow objects with generation 0, if we are generating object
                    // streams, the old object could have a non-zero generation.
                    if (obj.getGen() != 0) {
                        QTC::TC("qpdf", "QPDFWriter original obj non-zero gen");
                        writeString(" " + std::to_string(obj.getGen()));
                    }
                }
                writeString("\n");
            }

            offsets.push_back(m->pipeline->getCount());
            // To avoid double-counting objects being written in object streams for progress
            // reporting, decrement in pass 1.
            indicateProgress(true, false);

            QPDFObjectHandle obj_to_write = m->pdf.getObject(obj);
            if (obj_to_write.isStream()) {
                // This condition occurred in a fuzz input. Ideally we should block it at parse
                // time, but it's not clear to me how to construct a case for this.
                obj_to_write.warnIfPossible("stream found inside object stream; treating as null");
                obj_to_write = QPDFObjectHandle::newNull();
            }
            writeObject(obj_to_write, count);

            m->new_obj[new_obj].xref = QPDFXRefEntry(new_stream_id, count);
        }
    }
    {
        PipelinePopper pp_ostream(this);
        // Adjust offsets to skip over comment before first object
        first = offsets.at(0);
        for (auto& iter: offsets) {
            iter -= first;
        }

        // Take one pass at writing pairs of numbers so we can get their size information
        {
            PipelinePopper pp_discard(this);
            activatePipelineStack(pp_discard, true);
            writeObjectStreamOffsets(offsets, first_obj);
            first += m->pipeline->getCount();
        }

        // Set up a stream to write the stream data into a buffer.
        if (compressed) {
            activatePipelineStack(
                pp_ostream,
                pl::create<Pl_Flate>(
                    pl::create<pl::String>(stream_buffer_pass2), Pl_Flate::a_deflate));
        } else {
            activatePipelineStack(pp_ostream, stream_buffer_pass2);
        }
        writeObjectStreamOffsets(offsets, first_obj);
        writeString(stream_buffer_pass1);
        stream_buffer_pass1.clear();
        stream_buffer_pass1.shrink_to_fit();
    }

    // Write the object
    openObject(new_stream_id);
    setDataKey(new_stream_id);
    writeString("<<");
    writeStringQDF("\n ");
    writeString(" /Type /ObjStm");
    writeStringQDF("\n ");
    size_t length = stream_buffer_pass2.size();
    adjustAESStreamLength(length);
    writeString(" /Length " + std::to_string(length));
    writeStringQDF("\n ");
    if (compressed) {
        writeString(" /Filter /FlateDecode");
    }
    writeString(" /N " + std::to_string(offsets.size()));
    writeStringQDF("\n ");
    writeString(" /First " + std::to_string(first));
    if (!object.isNull()) {
        // If the original object has an /Extends key, preserve it.
        QPDFObjectHandle dict = object.getDict();
        QPDFObjectHandle extends = dict.getKey("/Extends");
        if (extends.isIndirect()) {
            QTC::TC("qpdf", "QPDFWriter copy Extends");
            writeStringQDF("\n ");
            writeString(" /Extends ");
            unparseChild(extends, 1, f_in_ostream);
        }
    }
    writeStringQDF("\n");
    writeStringNoQDF(" ");
    writeString(">>\nstream\n");
    if (m->encrypted) {
        QTC::TC("qpdf", "QPDFWriter encrypt object stream");
    }
    {
        PipelinePopper pp_enc(this);
        pushEncryptionFilter(pp_enc);
        writeString(stream_buffer_pass2);
    }
    if (m->newline_before_endstream) {
        writeString("\n");
    }
    writeString("endstream");
    m->cur_data_key.clear();
    closeObject(new_stream_id);
}